

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_crypto_tests.cpp
# Opt level: O1

void __thiscall wallet::wallet_crypto_tests::encrypt::test_method(encrypt *this)

{
  int iVar1;
  long in_FS_OFFSET;
  span<const_unsigned_char,_18446744073709551615UL> plaintext;
  span<const_unsigned_char,_18446744073709551615UL> plaintext_00;
  span<const_unsigned_char,_18446744073709551615UL> salt_00;
  Span<unsigned_char> bytes;
  CCrypter crypt;
  uint256 hash;
  array<unsigned_char,_8UL> salt;
  CCrypter local_80;
  SecureString local_48;
  uchar local_28 [8];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28[0] = '\0';
  local_28[1] = '\0';
  local_28[2] = 0xde;
  local_28[3] = 0xad;
  local_28[4] = 0xbe;
  local_28[5] = 0xef;
  local_28[6] = '\0';
  local_28[7] = '\0';
  CCrypter::CCrypter(&local_80);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::basic_string<char,std::char_traits<char>,secure_allocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,secure_allocator<char>> *)&local_48,
             "passphrase","");
  salt_00._M_extent._M_extent_value = 8;
  salt_00._M_ptr = local_28;
  CCrypter::SetKeyFromPassphrase(&local_80,&local_48,salt_00,25000,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::_M_destroy
              (&local_48,local_48.field_2._M_allocated_capacity);
  }
  local_48.field_2._M_allocated_capacity = 0xf170d6f07ff7b5fe;
  local_48.field_2._8_8_ = 0x9db253746819f602;
  local_48._M_dataplus._M_p = (pointer)0xf63fc09ae0adbc22;
  local_48._M_string_length = 0x5c88fe9c35146938;
  plaintext._M_extent._M_extent_value = 0x20;
  plaintext._M_ptr = (pointer)&local_48;
  TestCrypter::TestEncrypt
            (&local_80,plaintext,(span<const_unsigned_char,_18446744073709551615UL>)ZEXT816(0));
  iVar1 = 100;
  do {
    local_48.field_2._M_allocated_capacity = 0;
    local_48.field_2._8_8_ = 0;
    local_48._M_dataplus._M_p = (pointer)0x0;
    local_48._M_string_length = 0;
    bytes.m_size = 0x20;
    bytes.m_data = (uchar *)&local_48;
    GetRandBytes(bytes);
    plaintext_00._M_extent._M_extent_value = 0x20;
    plaintext_00._M_ptr = (pointer)&local_48;
    TestCrypter::TestEncrypt
              (&local_80,plaintext_00,(span<const_unsigned_char,_18446744073709551615UL>)ZEXT816(0))
    ;
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  CCrypter::~CCrypter(&local_80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(encrypt) {
    constexpr std::array<uint8_t, WALLET_CRYPTO_SALT_SIZE> salt{"0000deadbeef0000"_hex_u8};
    CCrypter crypt;
    crypt.SetKeyFromPassphrase("passphrase", salt, 25000, 0);
    TestCrypter::TestEncrypt(crypt, "22bcade09ac03ff6386914359cfe885cfeb5f77ff0d670f102f619687453b29d"_hex_u8);

    for (int i = 0; i != 100; i++)
    {
        uint256 hash(GetRandHash());
        TestCrypter::TestEncrypt(crypt, std::span<unsigned char>{hash.begin(), hash.end()});
    }

}